

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O1

ktx_error_code_e
ktxTexture1_CreateFromStream
          (ktxStream *pStream,ktxTextureCreateFlags createFlags,ktxTexture1 **newTex)

{
  ktx_error_code_e kVar1;
  ktxTexture1 *This;
  KTX_header header;
  KTX_header KStack_68;
  
  if (newTex == (ktxTexture1 **)0x0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else {
    This = (ktxTexture1 *)malloc(0x90);
    if (This == (ktxTexture1 *)0x0) {
      kVar1 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar1 = (*pStream->read)(pStream,&KStack_68,0x40);
      if (kVar1 == KTX_SUCCESS) {
        kVar1 = ktxTexture1_constructFromStreamAndHeader(This,pStream,&KStack_68,createFlags);
      }
      if (kVar1 != KTX_SUCCESS) {
        free(This);
        This = (ktxTexture1 *)0x0;
      }
      *newTex = This;
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture1_CreateFromStream(ktxStream* pStream,
                             ktxTextureCreateFlags createFlags,
                             ktxTexture1** newTex)
{
    KTX_error_code result;
    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture1* tex = (ktxTexture1*)malloc(sizeof(ktxTexture1));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture1_constructFromStream(tex, pStream, createFlags);
    if (result == KTX_SUCCESS)
        *newTex = (ktxTexture1*)tex;
    else {
        free(tex);
        *newTex = NULL;
    }
    return result;
}